

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

void __thiscall
irr::scene::CSceneManager::setActiveCamera(CSceneManager *this,ICameraSceneNode *camera)

{
  code *pcVar1;
  ICameraSceneNode *pIVar2;
  _func_int *p_Var3;
  
  if (camera != (ICameraSceneNode *)0x0) {
    pcVar1 = (camera->super_ISceneNode)._vptr_ISceneNode[-3] + -0x20 +
             (long)(camera->super_ISceneNode).AbsoluteTransformation.M;
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
  }
  pIVar2 = this->ActiveCamera;
  if (pIVar2 != (ICameraSceneNode *)0x0) {
    p_Var3 = (pIVar2->super_ISceneNode)._vptr_ISceneNode[-3];
    pcVar1 = p_Var3 + -0x20 + (long)(pIVar2->super_ISceneNode).AbsoluteTransformation.M;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)(p_Var3 + -0x30 +
                            (long)(pIVar2->super_ISceneNode).AbsoluteTransformation.M) + 8))();
    }
  }
  this->ActiveCamera = camera;
  return;
}

Assistant:

void CSceneManager::setActiveCamera(ICameraSceneNode *camera)
{
	if (camera)
		camera->grab();
	if (ActiveCamera)
		ActiveCamera->drop();

	ActiveCamera = camera;
}